

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test::testBody
          (TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test *this
          )

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test *local_10;
  TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_40);
  SimpleString::SimpleString(&local_50,"parameter");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_50,1);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_80,"parameter");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_80,1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_b0,"parameter");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var_01,iVar1),&local_b0,1);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_d0);
  SimpleString::SimpleString(&local_e0,"parameter");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var_02,iVar1),&local_e0,1);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_f0);
  return;
}

Assistant:

TEST(MockParameterTest, mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed)
{
    mock().expectOneCall("foo").withParameter("parameter", (unsigned)1);
    mock().actualCall("foo").withParameter("parameter", (unsigned long)1);

    mock().expectOneCall("foo").withParameter("parameter", (unsigned long)1);
    mock().actualCall("foo").withParameter("parameter", (unsigned)1);

    mock().checkExpectations();
}